

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveMessage.cpp
# Opt level: O2

void __thiscall
CDirectiveMessage::CDirectiveMessage(CDirectiveMessage *this,Type type,Expression *exp)

{
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveMessage_001c1c90;
  *(Type *)&(this->super_CAssemblerCommand).field_0x14 = type;
  Expression::Expression(&this->exp,exp);
  return;
}

Assistant:

CDirectiveMessage::CDirectiveMessage(Type type, Expression exp)
	: errorType(type), exp(exp)
{
}